

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e0a3::BuildEngineTest_duplicateRule_Test::~BuildEngineTest_duplicateRule_Test
          (BuildEngineTest_duplicateRule_Test *this)

{
  BuildEngineTest_duplicateRule_Test *this_local;
  
  ~BuildEngineTest_duplicateRule_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(BuildEngineTest, duplicateRule) {
  SimpleBuildEngineDelegate delegate;
  delegate.expectedError = true;

  core::BuildEngine engine(delegate);
  engine.addRule(std::unique_ptr<core::Rule>(new SimpleRule(
    "value-A", {}, [&] (const std::vector<int>& inputs) { return 1; })));
  engine.addRule(std::unique_ptr<core::Rule>(new SimpleRule(
    "value-A", {}, [&] (const std::vector<int>& inputs) { return 2; })));

  EXPECT_EQ(1U, delegate.errors.size());
  EXPECT_TRUE(delegate.errors[0].find("duplicate") != std::string::npos);
}